

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O1

void __thiscall
onmt::SentencePieceLearner::SentencePieceLearner
          (SentencePieceLearner *this,bool verbose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opts,string *input_filename,bool keep_vocab,bool keep_input_file)

{
  pointer pcVar1;
  long lVar2;
  pointer pbVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  SubwordLearner::SubwordLearner(&this->super_SubwordLearner,verbose,(Tokenizer *)0x0);
  (this->super_SubwordLearner)._vptr_SubwordLearner =
       (_func_int **)&PTR__SentencePieceLearner_00380ec0;
  local_38 = &(this->_args).field_2;
  (this->_args)._M_dataplus._M_p = (pointer)local_38;
  (this->_args)._M_string_length = 0;
  (this->_args).field_2._M_local_buf[0] = '\0';
  local_40 = &(this->_input_filename).field_2;
  (this->_input_filename)._M_dataplus._M_p = (pointer)local_40;
  pcVar1 = (input_filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_input_filename,pcVar1,pcVar1 + input_filename->_M_string_length);
  this->_keep_vocab = keep_vocab;
  (this->_input_stream)._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
  this->_keep_input_file = keep_input_file;
  pbVar3 = (opts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((opts->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      local_a0[0] = local_90;
      lVar2 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar7);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,lVar2,*(long *)((long)&pbVar3->_M_string_length + lVar7) + lVar2
                );
      std::__cxx11::string::append((char *)local_a0);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_a0,
                                  *(ulong *)((long)&(opts->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p + lVar7));
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_50 = *plVar5;
        lStack_48 = plVar4[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar5;
        local_60 = (long *)*plVar4;
      }
      local_58 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar4[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar5;
        local_80 = (long *)*plVar4;
      }
      local_78 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->_args,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      uVar6 = uVar6 + 2;
      pbVar3 = (opts->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x40;
    } while (uVar6 < (ulong)((long)(opts->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5))
    ;
  }
  return;
}

Assistant:

SentencePieceLearner::SentencePieceLearner(bool verbose,
                                             const std::vector<std::string>& opts,
                                             const std::string& input_filename,
                                             bool keep_vocab,
                                             bool keep_input_file)
    : SubwordLearner(verbose)
    , _input_filename(input_filename)
    , _keep_vocab(keep_vocab)
    , _keep_input_file(keep_input_file)
  {
    for(size_t i = 0; i < opts.size(); i += 2)
      _args += opts[i] + "=" + opts[i + 1] + " ";
  }